

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> * __thiscall
slang::ast::InterfacePortSymbol::getDeclaredRange
          (optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
           *__return_storage_ptr__,InterfacePortSymbol *this)

{
  optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *poVar1;
  bool bVar2;
  Scope *pSVar3;
  SyntaxNode *pSVar4;
  SyntaxNode *pSVar5;
  size_t sVar6;
  undefined7 uVar7;
  int iVar8;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  size_t extraout_RDX_00;
  long lVar9;
  LookupLocation LVar10;
  SmallVector<slang::ConstantRange,_4UL> buffer;
  ASTContext context;
  EvaluatedDimension dim;
  SmallVectorBase<slang::ConstantRange> local_c0;
  ASTContext local_88;
  EvaluatedDimension local_50;
  
  poVar1 = &this->range;
  if ((this->range).
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_engaged != true) {
    if ((this->interfaceDef != (DefinitionSymbol *)0x0) || ((this->isGeneric & 1U) != 0)) {
      pSVar3 = (this->super_Symbol).parentScope;
      pSVar4 = (this->super_Symbol).originatingSyntax;
      LVar10 = LookupLocation::before(&this->super_Symbol);
      src = LVar10._8_8_;
      local_88.lookupIndex = LVar10.index;
      local_88.flags.m_bits = 0x20;
      local_88.instanceOrProc = (Symbol *)0x0;
      local_88.firstTempVar = (TempVarSymbol *)0x0;
      local_88.randomizeDetails = (RandomizeDetails *)0x0;
      local_88.assertionInstance = (AssertionInstanceDetails *)0x0;
      local_c0.data_ = (pointer)local_c0.firstElement;
      local_c0.len = 0;
      local_c0.cap = 4;
      pSVar5 = pSVar4[3].previewNode;
      local_88.scope.ptr = pSVar3;
      if (pSVar5 != (SyntaxNode *)0x0) {
        pSVar4 = pSVar4[3].parent;
        bVar2 = (__return_storage_ptr__->
                super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                )._M_payload.
                super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                ._M_engaged;
        lVar9 = 0;
        do {
          ASTContext::evalDimension
                    (&local_50,&local_88,*(VariableDimensionSyntax **)((long)&pSVar4->kind + lVar9),
                     true,false);
          if (1 < local_50.kind - Range) {
            (__return_storage_ptr__->
            super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
            )._M_payload.
            super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
            ._M_engaged = false;
            goto LAB_00233b04;
          }
          SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
                    (&local_c0,&local_50.range);
          lVar9 = lVar9 + 8;
        } while ((long)pSVar5 << 3 != lVar9);
        (__return_storage_ptr__->
        super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
        ._M_engaged = bVar2;
        src = extraout_RDX;
      }
      iVar8 = SmallVectorBase<slang::ConstantRange>::copy
                        (&local_c0,(EVP_PKEY_CTX *)pSVar3->compilation,src);
      (this->range).
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_payload._M_value._M_ptr = (pointer)CONCAT44(extraout_var,iVar8);
      (this->range).
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_payload._M_value._M_extent._M_extent_value = extraout_RDX_00;
      if ((this->range).
          super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
          ._M_engaged == false) {
        (this->range).
        super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
        ._M_engaged = true;
      }
      uVar7 = *(undefined7 *)
               &(this->range).
                super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                .field_0x11;
      (__return_storage_ptr__->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_engaged = (this->range).
                   super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                   ._M_engaged;
      *(undefined7 *)
       &(__return_storage_ptr__->
        super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
        .field_0x11 = uVar7;
      sVar6 = (this->range).
              super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
              ._M_payload._M_value._M_extent._M_extent_value;
      (__return_storage_ptr__->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_payload._M_value._M_ptr =
           (poVar1->
           super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
           )._M_payload.
           super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
           ._M_payload._M_value._M_ptr;
      (__return_storage_ptr__->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_payload._M_value._M_extent._M_extent_value = sVar6;
LAB_00233b04:
      if (local_c0.data_ == (pointer)local_c0.firstElement) {
        return __return_storage_ptr__;
      }
      operator_delete(local_c0.data_);
      return __return_storage_ptr__;
    }
    (poVar1->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_ptr = (pointer)0x0;
    (this->range).
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_extent._M_extent_value = 0;
    (this->range).
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_engaged = true;
  }
  uVar7 = *(undefined7 *)
           &(this->range).
            super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
            .field_0x11;
  (__return_storage_ptr__->
  super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
  _M_engaged = (this->range).
               super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
               ._M_engaged;
  *(undefined7 *)
   &(__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    field_0x11 = uVar7;
  sVar6 = (this->range).
          super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
          ._M_payload._M_value._M_extent._M_extent_value;
  (__return_storage_ptr__->
  super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
  _M_payload._M_value._M_ptr =
       (poVar1->
       super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
       )._M_payload.
       super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
       _M_payload._M_value._M_ptr;
  (__return_storage_ptr__->
  super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
  _M_payload._M_value._M_extent._M_extent_value = sVar6;
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::span<const ConstantRange>> InterfacePortSymbol::getDeclaredRange() const {
    if (range)
        return range;

    if (isInvalid()) {
        range.emplace();
        return range;
    }

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);

    SmallVector<ConstantRange, 4> buffer;
    for (auto dimSyntax : syntax->as<DeclaratorSyntax>().dimensions) {
        auto dim = context.evalDimension(*dimSyntax, /* requireRange */ true, /* isPacked */ false);
        if (!dim.isRange())
            return std::nullopt;

        buffer.push_back(dim.range);
    }

    range = buffer.copy(scope->getCompilation());
    return range;
}